

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O1

void __thiscall
NormalMutexTest_TryLockFail_Test<yamc::fair::timed_mutex>::TestBody
          (NormalMutexTest_TryLockFail_Test<yamc::fair::timed_mutex> *this)

{
  undefined8 *puVar1;
  bool bVar2;
  char *in_R9;
  join_thread thd;
  AssertionResult gtest_ar_;
  barrier step;
  TypeParam mtx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_150;
  AssertHelper local_148;
  thread local_140;
  internal local_138 [8];
  undefined8 *local_130;
  undefined1 local_128 [32];
  barrier local_108;
  undefined1 local_98 [32];
  condition_variable local_78 [48];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_108.nthread_ = 2;
  local_108.count_ = 2;
  local_108.step_ = 0;
  std::condition_variable::condition_variable(&local_108.cv_);
  local_108.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_108.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_108.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_108.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_108.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  local_98._0_8_ = (TypeParam *)local_98;
  local_98._8_8_ = (TypeParam *)local_98;
  std::condition_variable::condition_variable(local_78);
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_128._8_8_ = &local_108;
  local_128._0_8_ = (TypeParam *)local_98;
  std::thread::
  thread<NormalMutexTest_TryLockFail_Test<yamc::fair::timed_mutex>::TestBody()::_lambda()_1_,,void>
            (&local_140,(anon_class_16_2_20c777b2_for__M_head_impl *)local_128);
  yamc::test::barrier::await(&local_108);
  bVar2 = yamc::fair::timed_mutex::try_lock((timed_mutex *)local_98);
  local_138[0] = (internal)!bVar2;
  local_130 = (undefined8 *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,local_138,(AssertionResult *)"mtx.try_lock()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,0x73,(char *)local_128._0_8_);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((TypeParam *)local_128._0_8_ != (TypeParam *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
    if (local_150._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_150._M_head_impl + 8))();
    }
  }
  puVar1 = local_130;
  if (local_130 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_130 != local_130 + 2) {
      operator_delete((undefined8 *)*local_130);
    }
    operator_delete(puVar1);
  }
  yamc::test::barrier::await(&local_108);
  yamc::test::join_thread::~join_thread((join_thread *)&local_140);
  std::condition_variable::~condition_variable(local_78);
  std::condition_variable::~condition_variable(&local_108.cv_);
  return;
}

Assistant:

TYPED_TEST(NormalMutexTest, TryLockFail)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock());
  });
  {
    step.await();  // b1
    EXPECT_FALSE(mtx.try_lock());
    step.await();  // b2
  }
}